

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_color2.c
# Opt level: O0

void draw_axis(float x,float y,float a,float a2,float l,float tl,char *label,int ticks,
              char *numformat,float num1,float num2,float num)

{
  ALLEGRO_FONT *pAVar1;
  undefined8 in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float in_XMM7_Da;
  float in_stack_00000008;
  float lv;
  float y2;
  float x2;
  int i;
  int local_3c;
  
  dVar4 = cos((double)in_XMM2_Da);
  dVar5 = sin((double)in_XMM2_Da);
  dVar5 = (double)in_XMM1_Da - (double)in_XMM4_Da * dVar5;
  al_draw_line(in_XMM0_Da,in_XMM1_Da,(float)((double)in_XMM4_Da * dVar4 + (double)in_XMM0_Da),
               CONCAT44((int)((ulong)dVar5 >> 0x20),(float)dVar5),example.white._0_8_,
               example.white._8_8_,0x3f800000);
  for (local_3c = 0; local_3c < in_ESI; local_3c = local_3c + 1) {
    dVar4 = cos((double)in_XMM2_Da);
    fVar2 = (float)((double)in_XMM0_Da +
                   ((double)in_XMM4_Da * dVar4 * (double)local_3c) / (double)(in_ESI + -1));
    dVar4 = sin((double)in_XMM2_Da);
    fVar3 = (float)((double)in_XMM1_Da -
                   ((double)in_XMM4_Da * dVar4 * (double)local_3c) / (double)(in_ESI + -1));
    dVar4 = cos((double)in_XMM3_Da);
    dVar5 = sin((double)in_XMM3_Da);
    dVar5 = (double)fVar3 - (double)in_XMM5_Da * dVar5;
    al_draw_line(fVar2,fVar3,(float)((double)in_XMM5_Da * dVar4 + (double)fVar2),
                 CONCAT44((int)((ulong)dVar5 >> 0x20),(float)dVar5),example.white._0_8_,
                 example.white._8_8_,0x3f800000);
    pAVar1 = example.font;
    dVar4 = cos((double)in_XMM3_Da);
    dVar5 = sin((double)in_XMM3_Da);
    al_draw_textf(example.white._0_8_,example.white._8_8_,
                  (float)(int)((double)(in_XMM5_Da + 2.0) * dVar4 + (double)fVar2),
                  (float)(int)((double)fVar3 - (double)(in_XMM5_Da + 2.0) * dVar5),
                  (double)(in_XMM6_Da +
                          ((float)local_3c * (in_XMM7_Da - in_XMM6_Da)) / (float)(in_ESI + -1)),
                  pAVar1,2,in_RDX);
  }
  fVar2 = ((in_stack_00000008 - in_XMM6_Da) * in_XMM4_Da) / (in_XMM7_Da - in_XMM6_Da);
  dVar4 = cos((double)in_XMM2_Da);
  dVar5 = sin((double)in_XMM2_Da);
  dVar5 = (double)in_XMM1_Da - (double)fVar2 * dVar5;
  al_draw_filled_circle
            ((float)((double)fVar2 * dVar4 + (double)in_XMM0_Da),
             CONCAT44((int)((ulong)dVar5 >> 0x20),(float)dVar5),0x41000000,example.white._0_8_,
             example.white._8_8_);
  pAVar1 = example.font;
  dVar4 = cos((double)in_XMM2_Da);
  dVar5 = sin((double)in_XMM2_Da);
  al_draw_textf(example.white._0_8_,example.white._8_8_,
                (float)((int)((double)(in_XMM4_Da + 4.0) * dVar4 + (double)in_XMM0_Da) + -0x18),
                (float)((int)((double)in_XMM1_Da - (double)(in_XMM4_Da + 4.0) * dVar5) + -0xc),
                pAVar1,0,"%s",in_RDI);
  return;
}

Assistant:

static void draw_axis(float x, float y, float a, float a2, float l,
      float tl, char const *label, int ticks,
      char const *numformat, float num1, float num2, float num) {
   al_draw_line(x, y, x + l * cos(a), y - l * sin(a), example.white, 1);
   int i;
   for (i = 0; i < ticks; i++) {
      float x2 = x + l * cos(a) * i / (ticks - 1);
      float y2 = y - l * sin(a) * i / (ticks - 1);
      al_draw_line(x2, y2, x2 + tl * cos(a2), y2 - tl * sin(a2), example.white, 1);
      al_draw_textf(example.font, example.white,
         (int)(x2 + (tl + 2) * cos(a2)), (int)(y2 - (tl + 2) * sin(a2)), ALLEGRO_ALIGN_RIGHT, numformat,
         num1 + i * (num2 - num1) / (ticks - 1));
   }
   float lv = (num - num1) * l / (num2 - num1);
   al_draw_filled_circle(x + lv * cos(a), y - lv * sin(a), 8, example.white);
   al_draw_textf(example.font, example.white,
      (int)(x + (l + 4) * cos(a)) - 24, (int)(y - (l + 4) * sin(a)) - 12, 0, "%s", label);
}